

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minimize_constraint.cpp
# Opt level: O3

bool __thiscall Clasp::DefaultMinimize::relaxBound(DefaultMinimize *this,bool full)

{
  long *plVar1;
  SharedData *pSVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  
  auVar4 = _DAT_001ac1c0;
  auVar3 = _DAT_001ac1b0;
  plVar1 = this->bounds_;
  if ((*plVar1 != 0x7fffffffffffffff) && ((ulong)this->size_ != 0)) {
    uVar5 = (ulong)this->size_ + 0x1fffffffffffffff;
    uVar6 = uVar5 & 0x1fffffffffffffff;
    auVar8._8_4_ = (int)uVar6;
    auVar8._0_8_ = uVar6;
    auVar8._12_4_ = (int)(uVar6 >> 0x20);
    lVar7 = 0;
    auVar8 = auVar8 ^ _DAT_001ac1c0;
    do {
      auVar9._8_4_ = (int)lVar7;
      auVar9._0_8_ = lVar7;
      auVar9._12_4_ = (int)((ulong)lVar7 >> 0x20);
      auVar9 = (auVar9 | auVar3) ^ auVar4;
      if ((bool)(~(auVar9._4_4_ == auVar8._4_4_ && auVar8._0_4_ < auVar9._0_4_ ||
                  auVar8._4_4_ < auVar9._4_4_) & 1)) {
        plVar1[lVar7] = 0x7fffffffffffffff;
      }
      if ((auVar9._12_4_ != auVar8._12_4_ || auVar9._8_4_ <= auVar8._8_4_) &&
          auVar9._12_4_ <= auVar8._12_4_) {
        plVar1[lVar7 + 1] = 0x7fffffffffffffff;
      }
      lVar7 = lVar7 + 2;
    } while ((uVar6 - ((uint)uVar5 & 1)) + 2 != lVar7);
  }
  pSVar2 = (this->super_MinimizeConstraint).shared_;
  this->pos_ = (Iter)(pSVar2 + 1);
  this->actLev_ = 0;
  if (!full) {
    if (pSVar2->optGen_ == 0) {
      if (pSVar2->mode_ != enumerate) {
        return true;
      }
    }
    else if ((pSVar2->mode_ != enumerate) &&
            ((pSVar2->gCount_).super___atomic_base<unsigned_int>._M_i != pSVar2->optGen_)) {
      return true;
    }
  }
  stepInit(this,0);
  return true;
}

Assistant:

bool DefaultMinimize::relaxBound(bool full) {
	if (active()) { std::fill(opt(), opt()+size_, SharedData::maxBound()); }
	pos_       = shared_->lits;
	actLev_    = 0;
	if (full || !shared_->optimize()) { stepInit(0); }
	return true;
}